

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_and_b(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  uint uVar2;
  int ret;
  uint32_t y_prop;
  uint32_t x_prop;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  node_local._4_4_ = verify_miniscript_two_param_check(node,parent);
  if (node_local._4_4_ == 0) {
    uVar1 = node->child->type_properties;
    uVar2 = node->child->next->type_properties;
    node->type_properties = 0x21000;
    node->type_properties = uVar1 & uVar2 & 0x10900 | node->type_properties;
    node->type_properties = (uVar1 | uVar2) & 0x8000 | node->type_properties;
    node->type_properties = uVar1 & 0x400 | node->type_properties;
    if ((uVar2 & 8) != 0) {
      node->type_properties = uVar1 & 1 | node->type_properties;
    }
    if (((uVar1 | uVar2) & 0x100) != 0) {
      node->type_properties = (uVar1 | uVar2) & 0x200 | node->type_properties;
    }
    if ((uVar1 & 0x100) != 0) {
      node->type_properties = uVar2 & 0x400 | node->type_properties;
    }
    if ((uVar1 & uVar2 & 0x8000) != 0) {
      node->type_properties = uVar1 & uVar2 & 0x2000 | node->type_properties;
    }
    if ((((uVar1 & uVar2 & 0x4000) != 0) || (((uVar1 ^ 0xffffffff) & 0xc000) == 0)) ||
       (((uVar2 ^ 0xffffffff) & 0xc000) == 0)) {
      node->type_properties = node->type_properties | 0x4000;
    }
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_miniscript_and_b(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop, y_prop;
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret != WALLY_OK)
        return ret;

    x_prop = node->child->type_properties;
    y_prop = node->child->next->type_properties;
    node->type_properties = MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_X;
    node->type_properties |= x_prop & y_prop &
                             (MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_Z | MINISCRIPT_PROPERTY_M);
    node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_S;
    node->type_properties |= x_prop & MINISCRIPT_PROPERTY_N;
    if (y_prop & MINISCRIPT_TYPE_W)
        node->type_properties |= x_prop & MINISCRIPT_TYPE_B;
    if ((x_prop | y_prop) & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_O;
    if (x_prop & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= y_prop & MINISCRIPT_PROPERTY_N;
    if ((x_prop & y_prop) & MINISCRIPT_PROPERTY_S)
        node->type_properties |= x_prop & y_prop & MINISCRIPT_PROPERTY_E;
    if (((x_prop & y_prop) & MINISCRIPT_PROPERTY_F) ||
        !(~x_prop & (MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_F)) ||
        !(~y_prop & (MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_F)))
        node->type_properties |= MINISCRIPT_PROPERTY_F;

    return WALLY_OK;
}